

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O2

void Abc_NtkDumpBlif(Abc_Ntk_t *p)

{
  Abc_Ntk_t *pNtk;
  int iVar1;
  FILE *__stream;
  undefined4 extraout_var;
  Vec_Ptr_t *p_00;
  uint uVar2;
  Abc_Obj_t *local_40;
  Abc_Ntk_t *local_38;
  
  __stream = fopen("multi_and.blif","wb");
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,".model %s\n","multi_and");
    fwrite(".inputs",7,1,__stream);
    for (uVar2 = 0; (int)uVar2 < p->vCis->nSize; uVar2 = uVar2 + 1) {
      fprintf(__stream," i%d",(ulong)uVar2);
    }
    fputc(10,__stream);
    fwrite(".outputs",8,1,__stream);
    for (uVar2 = 0; (int)uVar2 < p->vCos->nSize; uVar2 = uVar2 + 1) {
      fprintf(__stream," o%d",(ulong)uVar2);
    }
    iVar1 = fputc(10,__stream);
    local_40 = (Abc_Obj_t *)CONCAT44(extraout_var,iVar1);
    for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
      local_40 = (Abc_Obj_t *)Vec_PtrEntry(p->vCis,iVar1);
      (local_40->field_6).iTemp = iVar1;
    }
    local_38 = p;
    for (uVar2 = 0; pNtk = local_38, (int)uVar2 < local_38->vCos->nSize; uVar2 = uVar2 + 1) {
      local_40 = Abc_NtkCo(local_38,uVar2);
      p_00 = Abc_NtkNodeSupport(pNtk,&local_40,1);
      fwrite(".names",6,1,__stream);
      for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
        local_40 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
        fprintf(__stream," i%d",(ulong)(uint)(local_40->field_6).iTemp);
      }
      fprintf(__stream," o%d\n",(ulong)uVar2);
      for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
        local_40 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar1);
        fputc(0x31,__stream);
      }
      fwrite(" 1\n",3,1,__stream);
      Vec_PtrFree(p_00);
    }
    fwrite(".end\n\n",6,1,__stream);
    fclose(__stream);
    return;
  }
  puts("Cannot open output file.");
  return;
}

Assistant:

void Abc_NtkDumpBlif( Abc_Ntk_t * p )
{
    FILE * pFile;
    Vec_Ptr_t * vSupp;
    Abc_Obj_t * pObj;
    int i, k;
    pFile = fopen( "multi_and.blif", "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file.\n" );
        return;
    }
    fprintf( pFile, ".model %s\n", "multi_and" );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < Abc_NtkCiNum(p); i++ )
        fprintf( pFile, " i%d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    for ( i = 0; i < Abc_NtkCoNum(p); i++ )
        fprintf( pFile, " o%d", i );
    fprintf( pFile, "\n" );
    Abc_NtkForEachCi( p, pObj, i )
        pObj->iTemp = i;
    for ( i = 0; i < Abc_NtkCoNum(p); i++ )
    {
        pObj = Abc_NtkCo( p, i );
        vSupp = Abc_NtkNodeSupport( p, &pObj, 1 );
        fprintf( pFile, ".names" );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            fprintf( pFile, " i%d", pObj->iTemp );
        fprintf( pFile, " o%d\n", i );
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, k )
            fprintf( pFile, "1" );
        fprintf( pFile, " 1\n" );
        Vec_PtrFree( vSupp );
    }
    fprintf( pFile, ".end\n\n" );
    fclose( pFile );
}